

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chop.cpp
# Opt level: O0

handle_t handlegraph::algorithms::combine_handles
                   (MutablePathDeletableHandleGraph *graph,
                   vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *handles)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  const_reference pvVar4;
  handle_t hVar5;
  long *plVar6;
  undefined8 in_RSI;
  long *in_RDI;
  handle_t *h_1;
  iterator __end2_3;
  iterator __begin2_3;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *__range2_3;
  handle_t *h;
  iterator __end2_2;
  iterator __begin2_2;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *__range2_2;
  handle_t *handle_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *__range2_1;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> edges_rev_rev;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> edges_rev_fwd;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> edges_fwd_rev;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> edges_fwd_fwd;
  handle_t *handle;
  const_iterator __end2;
  const_iterator __begin2;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *__range2;
  string seq;
  handle_t combined;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *in_stack_fffffffffffffdc8;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *in_stack_fffffffffffffdd0;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *in_stack_fffffffffffffde0;
  anon_class_8_1_60dad25e *in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  undefined1 go_left;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  HandleGraph *in_stack_fffffffffffffe30;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *local_178;
  undefined8 local_170;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *local_168;
  handle_t *local_160;
  __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
  local_158;
  undefined1 *local_150;
  undefined8 local_148;
  undefined8 local_140;
  reference local_138;
  handle_t *local_130;
  __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
  local_128;
  undefined1 *local_120;
  reference local_118;
  handle_t *local_110;
  __normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
  local_108;
  undefined8 local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 local_b8 [24];
  undefined1 local_a0 [40];
  string local_78 [32];
  reference local_58;
  handle_t *local_50;
  __normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
  local_48;
  undefined8 local_40;
  string local_38 [32];
  undefined8 local_18;
  long *local_10;
  char local_8 [8];
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::__cxx11::string::string(local_38);
  local_40 = local_18;
  local_48._M_current =
       (handle_t *)
       std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::begin
                 (in_stack_fffffffffffffdc8);
  local_50 = (handle_t *)
             std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::end
                       (in_stack_fffffffffffffdc8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                        *)in_stack_fffffffffffffdd0,
                       (__normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                        *)in_stack_fffffffffffffdc8);
    go_left = (undefined1)((ulong)in_stack_fffffffffffffe20 >> 0x38);
    if (!bVar2) break;
    local_58 = __gnu_cxx::
               __normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
               ::operator*(&local_48);
    (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb0)) + 0x40))
              (local_78,(long)local_10 + *(long *)(*local_10 + -0xb0),local_58);
    std::__cxx11::string::append(local_38);
    std::__cxx11::string::~string(local_78);
    __gnu_cxx::
    __normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
    ::operator++(&local_48);
  }
  local_8 = (char  [8])
            (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0x1d0)) + 0xa0))
                      ((long)local_10 + *(long *)(*local_10 + -0x1d0),local_38);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::vector
            ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)0x2853d6);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::vector
            ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)0x2853e3);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::vector
            ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)0x2853f0);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::vector
            ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)0x2853fd);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::back
            (in_stack_fffffffffffffdd0);
  local_f0 = local_a0;
  HandleGraph::
  follow_edges<handlegraph::algorithms::combine_handles(handlegraph::MutablePathDeletableHandleGraph&,std::vector<handlegraph::handle_t,std::allocator<handlegraph::handle_t>>const&)::__0>
            (in_stack_fffffffffffffe30,
             (handle_t *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),(bool)go_left
             ,in_stack_fffffffffffffe18);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::front
            (in_stack_fffffffffffffdd0);
  local_f8 = local_b8;
  HandleGraph::
  follow_edges<handlegraph::algorithms::combine_handles(handlegraph::MutablePathDeletableHandleGraph&,std::vector<handlegraph::handle_t,std::allocator<handlegraph::handle_t>>const&)::__1>
            (in_stack_fffffffffffffe30,
             (handle_t *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),(bool)go_left
             ,(anon_class_8_1_60dafd4e *)in_stack_fffffffffffffe18);
  local_100 = local_18;
  local_108._M_current =
       (handle_t *)
       std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::begin
                 (in_stack_fffffffffffffdc8);
  local_110 = (handle_t *)
              std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::end
                        (in_stack_fffffffffffffdc8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                             *)in_stack_fffffffffffffdd0,
                            (__normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                             *)in_stack_fffffffffffffdc8), bVar2) {
    local_118 = __gnu_cxx::
                __normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                ::operator*(&local_108);
    (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0x1e0)) + 0xf8))
              ((long)local_10 + *(long *)(*local_10 + -0x1e0),local_118);
    __gnu_cxx::
    __normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
    ::operator++(&local_108);
  }
  local_120 = local_a0;
  local_128._M_current =
       (handle_t *)
       std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::begin
                 (in_stack_fffffffffffffdc8);
  local_130 = (handle_t *)
              std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::end
                        (in_stack_fffffffffffffdc8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                             *)in_stack_fffffffffffffdd0,
                            (__normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                             *)in_stack_fffffffffffffdc8), bVar2) {
    local_138 = __gnu_cxx::
                __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                ::operator*(&local_128);
    std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::front
              (in_stack_fffffffffffffdd0);
    bVar2 = handlegraph::operator==
                      ((handle_t *)in_stack_fffffffffffffdd0,(handle_t *)in_stack_fffffffffffffdc8);
    plVar6 = local_10;
    if (bVar2) {
      (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0x1d0)) + 0xb0))
                ((long)local_10 + *(long *)(*local_10 + -0x1d0),local_8);
    }
    else {
      lVar1 = *(long *)(*local_10 + -0xb0);
      lVar3 = (long)local_10 + lVar1;
      pvVar4 = std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::back
                         (in_stack_fffffffffffffdd0);
      local_140 = (**(code **)(*(long *)((long)plVar6 + lVar1) + 0x30))(lVar3,pvVar4);
      bVar2 = handlegraph::operator==
                        ((handle_t *)in_stack_fffffffffffffdd0,(handle_t *)in_stack_fffffffffffffdc8
                        );
      if (bVar2) {
        lVar1 = *(long *)(*local_10 + -0xb0);
        plVar6 = (long *)((long)local_10 + *(long *)(*local_10 + -0x1d0));
        local_148 = (**(code **)(*(long *)((long)local_10 + lVar1) + 0x30))
                              ((long)local_10 + lVar1,local_8);
        (**(code **)(*plVar6 + 0xb0))(plVar6,local_8,&local_148);
      }
      else {
        (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0x1d0)) + 0xb0))
                  ((long)local_10 + *(long *)(*local_10 + -0x1d0),local_8,local_138);
      }
    }
    __gnu_cxx::
    __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
    ::operator++(&local_128);
  }
  local_150 = local_b8;
  local_158._M_current =
       (handle_t *)
       std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::begin
                 (in_stack_fffffffffffffdc8);
  local_160 = (handle_t *)
              std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::end
                        (in_stack_fffffffffffffdc8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                             *)in_stack_fffffffffffffdd0,
                            (__normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                             *)in_stack_fffffffffffffdc8), bVar2) {
    local_168 = (vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
                __gnu_cxx::
                __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                ::operator*(&local_158);
    std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::back
              (in_stack_fffffffffffffdd0);
    bVar2 = handlegraph::operator==
                      ((handle_t *)in_stack_fffffffffffffdd0,(handle_t *)in_stack_fffffffffffffdc8);
    plVar6 = local_10;
    if (bVar2) {
      (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0x1d0)) + 0xb0))
                ((long)local_10 + *(long *)(*local_10 + -0x1d0),local_8);
    }
    else {
      lVar1 = *(long *)(*local_10 + -0xb0);
      lVar3 = (long)local_10 + lVar1;
      in_stack_fffffffffffffde0 = local_168;
      pvVar4 = std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::front
                         (in_stack_fffffffffffffdd0);
      local_170 = (**(code **)(*(long *)((long)plVar6 + lVar1) + 0x30))(lVar3,pvVar4);
      bVar2 = handlegraph::operator==
                        ((handle_t *)in_stack_fffffffffffffdd0,(handle_t *)in_stack_fffffffffffffdc8
                        );
      if (bVar2) {
        lVar1 = *(long *)(*local_10 + -0xb0);
        in_stack_fffffffffffffdc8 =
             (vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
             ((long)local_10 + *(long *)(*local_10 + -0x1d0));
        in_stack_fffffffffffffdd0 =
             (vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
             (**(code **)(*(long *)((long)local_10 + lVar1) + 0x30))((long)local_10 + lVar1,local_8)
        ;
        local_178 = in_stack_fffffffffffffdd0;
        (**(code **)(in_stack_fffffffffffffdc8->
                    super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                    )._M_impl.super__Vector_impl_data._M_start[0x16].data)
                  (in_stack_fffffffffffffdc8,&local_178,local_8);
      }
      else {
        (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0x1d0)) + 0xb0))
                  ((long)local_10 + *(long *)(*local_10 + -0x1d0),local_168,local_8);
      }
    }
    __gnu_cxx::
    __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
    ::operator++(&local_158);
  }
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~vector
            (in_stack_fffffffffffffde0);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~vector
            (in_stack_fffffffffffffde0);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~vector
            (in_stack_fffffffffffffde0);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~vector
            (in_stack_fffffffffffffde0);
  std::__cxx11::string::~string(local_38);
  hVar5.data[0] = local_8[0];
  hVar5.data[1] = local_8[1];
  hVar5.data[2] = local_8[2];
  hVar5.data[3] = local_8[3];
  hVar5.data[4] = local_8[4];
  hVar5.data[5] = local_8[5];
  hVar5.data[6] = local_8[6];
  hVar5.data[7] = local_8[7];
  return (handle_t)hVar5.data;
}

Assistant:

handle_t combine_handles(MutablePathDeletableHandleGraph& graph,
                         const std::vector<handle_t>& handles) {
    std::string seq;
    for (auto& handle : handles) {
        seq.append(graph.get_sequence(handle));
    }
    handle_t combined = graph.create_handle(seq);
    // relink the inbound and outbound nodes
    // get the edge context
    std::vector<handle_t> edges_fwd_fwd;
    std::vector<handle_t> edges_fwd_rev;
    std::vector<handle_t> edges_rev_fwd;
    std::vector<handle_t> edges_rev_rev;
    graph.follow_edges(
                       handles.back(), false,
                       [&](const handle_t& h) {
        edges_fwd_fwd.push_back(h);
    });
    graph.follow_edges(
                       handles.front(), true,
                       [&](const handle_t& h) {
        edges_fwd_rev.push_back(h);
    });
    // destroy the old handles
    for (auto& handle : handles) {
        graph.destroy_handle(handle);
    }
    // connect the ends to the previous context
    // check that we're not trying to make edges that connect back with the nodes in the component
    // there are three cases
    // self looping, front and rear inverting
    for (auto& h : edges_fwd_fwd) {
        if (h == handles.front()) {
            graph.create_edge(combined, combined);
        } else if (h == graph.flip(handles.back())) {
            graph.create_edge(combined, graph.flip(combined));
        } else {
            graph.create_edge(combined, h);
        }
    }
    for (auto& h : edges_fwd_rev) {
        if (h == handles.back()) {
            graph.create_edge(combined, combined);
        } else if (h == graph.flip(handles.front())) {
            graph.create_edge(graph.flip(combined), combined);
        } else {
            graph.create_edge(h, combined);
        }
    }
    return combined;
}